

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

tc_toktyp_t __thiscall
CTcTokenizer::xlat_string_to_src(CTcTokenizer *this,tok_embed_ctx *ec,int force_embed_end)

{
  tc_toktyp_t tVar1;
  size_t sVar2;
  undefined4 in_EDX;
  CTcTokenizer *in_RSI;
  CTcTokenizer *in_RDI;
  tc_toktyp_t typ;
  int in_stack_000000c4;
  tok_embed_ctx *in_stack_000000c8;
  CTcToken *in_stack_000000d0;
  utf8_ptr *in_stack_000000d8;
  char *in_stack_000000e0;
  CTcTokenizer *in_stack_000000e8;
  undefined4 in_stack_ffffffffffffffe8;
  
  CTcTokString::get_text_len(in_RDI->curbuf_);
  utf8_ptr::getptr(&in_RDI->p_);
  CTcTokString::get_text(in_RDI->curbuf_);
  reserve_source(in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  tVar1 = xlat_string_to(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,
                         in_stack_000000c8,in_stack_000000c4);
  sVar2 = CTcToken::get_text_len(&in_RDI->curtok_);
  commit_source(in_RDI,sVar2 + 1);
  return tVar1;
}

Assistant:

tc_toktyp_t CTcTokenizer::xlat_string_to_src(
    tok_embed_ctx *ec, int force_embed_end)
{
    /* 
     *   Reserve space for the entire rest of the line.  This is
     *   conservative, in that we will definitely need less space than
     *   this.  This might cause us to waste a little space here and
     *   there, since we will over-allocate when we have a short string
     *   early in a long line, but this will save us the time of scanning
     *   the string twice just to see how long it is. 
     */
    reserve_source(curbuf_->get_text_len() -
                   (p_.getptr() - curbuf_->get_text()));

    /* translate into the source block */
    tc_toktyp_t typ = xlat_string_to(
        src_ptr_, &p_, &curtok_, ec, force_embed_end);

    /* commit the space in the source block */
    commit_source(curtok_.get_text_len() + 1);

    /* return the string token */
    return typ;
}